

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.yy.cpp
# Opt level: O0

YY_BUFFER_STATE yy_create_buffer(FILE *file,int size,yyscan_t yyscanner)

{
  YY_BUFFER_STATE msg;
  char *pcVar1;
  int in_ESI;
  yyscan_t unaff_retaddr;
  YY_BUFFER_STATE b;
  yyscan_t in_stack_ffffffffffffffd8;
  yy_size_t in_stack_ffffffffffffffe0;
  
  msg = (YY_BUFFER_STATE)yyalloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (msg == (YY_BUFFER_STATE)0x0) {
    yy_fatal_error((char *)0x0,in_stack_ffffffffffffffd8);
  }
  msg->yy_buf_size = in_ESI;
  pcVar1 = (char *)yyalloc((yy_size_t)msg,in_stack_ffffffffffffffd8);
  msg->yy_ch_buf = pcVar1;
  if (msg->yy_ch_buf == (char *)0x0) {
    yy_fatal_error((char *)msg,in_stack_ffffffffffffffd8);
  }
  msg->yy_is_our_buffer = 1;
  yy_init_buffer((YY_BUFFER_STATE)yyscanner,(FILE *)b,unaff_retaddr);
  return msg;
}

Assistant:

YY_BUFFER_STATE yy_create_buffer  (FILE * file, int  size , yyscan_t yyscanner)
{
	YY_BUFFER_STATE b;
    
	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state ) , yyscanner );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_buf_size = size;

	/* yy_ch_buf has to be 2 characters longer than the size given because
	 * we need to put in 2 end-of-buffer characters.
	 */
	b->yy_ch_buf = (char *) yyalloc( (yy_size_t) (b->yy_buf_size + 2) , yyscanner );
	if ( ! b->yy_ch_buf )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_is_our_buffer = 1;

	yy_init_buffer( b, file , yyscanner);

	return b;
}